

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDirFrame.cpp
# Opt level: O2

void __thiscall chrono::fea::ChLinkDirFrame::ConstraintsLoadJacobians(ChLinkDirFrame *this)

{
  ChQuaternion<double> *q;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChRowVectorRef local_280;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true> local_260;
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
  local_230;
  ChVector<double> Zo;
  ChMatrix33<double> Jra;
  ChMatrix33<double> Jrb;
  ChQuaternion<double> local_150;
  undefined8 local_130;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  ChMatrix33<double> Arw;
  ChMatrix33<double> Aro;
  ChMatrix33<double> Aow;
  
  ChMatrix33<double>::Set_A_quaternion
            (&Aow,&(((this->m_body).
                     super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  q = &(this->m_csys).rot;
  ChMatrix33<double>::Set_A_quaternion(&Aro,q);
  ChQuaternion<double>::operator>>
            (&local_150,q,
             &(((this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  ChMatrix33<double>::Set_A_quaternion(&Arw,&local_150);
  local_150.m_data[0] = (double)&Aow;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_150,
                    (ChVector<double> *)
                    &(((this->m_node).
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_ChNodeFEAxyz).field_0xf0);
  auVar1._8_8_ = Zo.m_data[1];
  auVar1._0_8_ = Zo.m_data[0];
  local_150.m_data[0] = 0.0;
  auVar2._0_8_ = -Zo.m_data[2];
  auVar2._8_4_ = 0;
  auVar2._12_4_ = 0x80000000;
  local_128._0_8_ = -Zo.m_data[0];
  local_128._8_4_ = SUB84(Zo.m_data[1],0);
  local_128._12_4_ = (uint)((ulong)Zo.m_data[1] >> 0x20) ^ 0x80000000;
  local_150.m_data[1] = (double)vmovlps_avx(auVar2);
  local_150.m_data[3] = Zo.m_data[2];
  local_130 = 0;
  local_150.m_data[2] = Zo.m_data[1];
  local_118 = vmovlps_avx(auVar1);
  local_110 = 0;
  Jra.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&Aro;
  Jra.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_150;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jrb,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&Jra);
  local_230.
  super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
  .
  super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>,_0>
  .m_data = (PointerType)&Arw;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jra,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_230);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_260,(Matrix<double,_3,_3,_1,_3,_3> *)&Jra,1);
  ChConstraintTwoGeneric::Get_Cq_a(&local_280,&this->constraint1);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_230,&local_280,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_230.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_260);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_260,(Matrix<double,_3,_3,_1,_3,_3> *)&Jra,2);
  ChConstraintTwoGeneric::Get_Cq_a(&local_280,&this->constraint2);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_230,&local_280,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_230.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_260);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_260,&Jrb.super_Matrix<double,_3,_3,_1,_3,_3>,1);
  ChConstraintTwoGeneric::Get_Cq_b(&local_280,&this->constraint1);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_230,&local_280,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_230.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_260);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
  BlockImpl_dense(&local_260,&Jrb.super_Matrix<double,_3,_3,_1,_3,_3>,2);
  ChConstraintTwoGeneric::Get_Cq_b(&local_280,&this->constraint2);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock(&local_230,&local_280,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
            (&local_230.
              super_Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
             ,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_260);
  return;
}

Assistant:

void ChLinkDirFrame::ConstraintsLoadJacobians() {
    // compute jacobians
    ChMatrix33<> Aow(m_body->coord.rot);
    ChMatrix33<> Aro(m_csys.rot);
    ChMatrix33<> Arw(m_csys.rot >> m_body->coord.rot);

    ChVector<> Zo = Aow.transpose() * m_node->GetD();

    ChStarMatrix33<> ztilde(Zo);

    ChMatrix33<> Jrb = Aro.transpose() * ztilde;

    ChMatrix33<> Jra = Arw.transpose();

    constraint1.Get_Cq_a().segment(0, 3) = Jra.row(1);
    constraint2.Get_Cq_a().segment(0, 3) = Jra.row(2);

    constraint1.Get_Cq_b().segment(3, 3) = Jrb.row(1);
    constraint2.Get_Cq_b().segment(3, 3) = Jrb.row(2);
}